

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

Own<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::String,_kj::Array<kj::ArrayPtr<const_unsigned_char>_>_>_>,_kj::_::PromiseDisposer>
 __thiscall
kj::_::PromiseDisposer::
alloc<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::String,kj::Array<kj::ArrayPtr<unsigned_char_const>>>>,kj::_::PromiseDisposer,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::_::Tuple<kj::String,kj::Array<kj::ArrayPtr<unsigned_char_const>>>>
          (PromiseDisposer *this,Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *params,
          Tuple<kj::String,_kj::Array<kj::ArrayPtr<const_unsigned_char>_>_> *params_1)

{
  void *pvVar1;
  
  pvVar1 = operator_new(0x400);
  AttachmentPromiseNode<kj::_::Tuple<kj::String,_kj::Array<kj::ArrayPtr<const_unsigned_char>_>_>_>::
  AttachmentPromiseNode
            ((AttachmentPromiseNode<kj::_::Tuple<kj::String,_kj::Array<kj::ArrayPtr<const_unsigned_char>_>_>_>
              *)((long)pvVar1 + 0x3b8),params,params_1);
  *(void **)((long)pvVar1 + 0x3c0) = pvVar1;
  *(AttachmentPromiseNode<kj::_::Tuple<kj::String,_kj::Array<kj::ArrayPtr<const_unsigned_char>_>_>_>
    **)this = (AttachmentPromiseNode<kj::_::Tuple<kj::String,_kj::Array<kj::ArrayPtr<const_unsigned_char>_>_>_>
               *)((long)pvVar1 + 0x3b8);
  return (Own<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::String,_kj::Array<kj::ArrayPtr<const_unsigned_char>_>_>_>,_kj::_::PromiseDisposer>
          )(AttachmentPromiseNode<kj::_::Tuple<kj::String,_kj::Array<kj::ArrayPtr<const_unsigned_char>_>_>_>
            *)this;
}

Assistant:

static kj::Own<T, D> alloc(Params&&... params) noexcept {
    // Implements allocPromise().
    T* ptr;
    if (!canArenaAllocate<T>()) {
      // Node too big (or needs weird alignment), fall back to regular heap allocation.
      ptr = new T(kj::fwd<Params>(params)...);
    } else {
      // Start a new arena.
      //
      // NOTE: As in appendPromise() (below), we don't implement exception-safety because it causes
      //   code bloat and these constructors probably don't throw. Instead this function is
      //   noexcept, so if a constructor does throw, it'll crash rather than leak memory.
      auto* arena = new PromiseArena;
      ptr = reinterpret_cast<T*>(arena + 1) - 1;
      ctor(*ptr, kj::fwd<Params>(params)...);
      ptr->arena = arena;
      KJ_IREQUIRE(reinterpret_cast<void*>(ptr) ==
                  reinterpret_cast<void*>(static_cast<PromiseArenaMember*>(ptr)),
          "PromiseArenaMember must be the leftmost inherited type.");
    }
    return kj::Own<T, D>(ptr);
  }